

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# loopsubdiv.cpp
# Opt level: O2

void __thiscall pbrt::SDFace::SDFace(SDFace *this)

{
  int i;
  long lVar1;
  
  for (lVar1 = -0x18; lVar1 != 0; lVar1 = lVar1 + 8) {
    *(undefined8 *)((long)this->f + lVar1) = 0;
    *(undefined8 *)((long)this->children + lVar1) = 0;
  }
  for (lVar1 = 0; lVar1 != 4; lVar1 = lVar1 + 1) {
    this->children[lVar1] = (SDFace *)0x0;
  }
  return;
}

Assistant:

SDFace() {
        for (int i = 0; i < 3; ++i) {
            v[i] = nullptr;
            f[i] = nullptr;
        }
        for (int i = 0; i < 4; ++i)
            children[i] = nullptr;
    }